

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Parsing::File::rm(File *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  bVar1 = isFile(this);
  bVar3 = false;
  if ((bVar1) && (bVar3 = false, (this->_path)._M_string_length != 0)) {
    iVar2 = remove((this->_path)._M_dataplus._M_p);
    bVar3 = iVar2 == 0;
  }
  return bVar3;
}

Assistant:

bool File::rm() const noexcept
    {
        if (!isFile() || _path.empty())
            return false;
        if (remove(_path.c_str()) != 0)
            return false;
        return true;
    }